

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

String * doctest::toString<float>(String *__return_storage_ptr__,IsNaN<float> in)

{
  char *in_00;
  String local_a0;
  String local_88;
  String local_70;
  String local_58;
  String local_40;
  String local_28;
  
  in_00 = "! ";
  if (((ulong)in >> 0x20 & 1) == 0) {
    in_00 = "";
  }
  String::String(&local_58,in_00);
  String::String(&local_70,"IsNaN( ");
  operator+(&local_40,&local_58,&local_70);
  detail::toStreamLit<float>(&local_88,in.value);
  operator+(&local_28,&local_40,&local_88);
  String::String(&local_a0," )");
  operator+(__return_storage_ptr__,&local_28,&local_a0);
  String::~String(&local_a0);
  String::~String(&local_28);
  String::~String(&local_88);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }